

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_deriveBlockSplitsHelper
               (seqStoreSplits *splits,size_t startIdx,size_t endIdx,ZSTD_CCtx *zc,
               seqStore_t *origSeqStore)

{
  uint uVar1;
  seqStore_t *resultSeqStore;
  seqStore_t *resultSeqStore_00;
  ulong endIdx_00;
  size_t code;
  size_t code_00;
  size_t code_01;
  size_t midIdx;
  size_t estimatedSecondHalfSize;
  size_t estimatedFirstHalfSize;
  size_t estimatedOriginalSize;
  seqStore_t *secondHalfSeqStore;
  seqStore_t *firstHalfSeqStore;
  seqStore_t *fullSeqStoreChunk;
  seqStore_t *origSeqStore_local;
  ZSTD_CCtx *zc_local;
  size_t endIdx_local;
  size_t startIdx_local;
  seqStoreSplits *splits_local;
  
  resultSeqStore = &(zc->blockSplitCtx).firstHalfSeqStore;
  resultSeqStore_00 = &(zc->blockSplitCtx).secondHalfSeqStore;
  endIdx_00 = startIdx + endIdx >> 1;
  if (startIdx <= endIdx) {
    if ((299 < endIdx - startIdx) && (splits->idx < 0xc4)) {
      ZSTD_deriveSeqStoreChunk(&(zc->blockSplitCtx).fullSeqStoreChunk,origSeqStore,startIdx,endIdx);
      ZSTD_deriveSeqStoreChunk(resultSeqStore,origSeqStore,startIdx,endIdx_00);
      ZSTD_deriveSeqStoreChunk(resultSeqStore_00,origSeqStore,endIdx_00,endIdx);
      code = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize
                       (&(zc->blockSplitCtx).fullSeqStoreChunk,zc);
      code_00 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(resultSeqStore,zc);
      code_01 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(resultSeqStore_00,zc);
      uVar1 = ERR_isError(code);
      if ((uVar1 == 0) &&
         (((uVar1 = ERR_isError(code_00), uVar1 == 0 && (uVar1 = ERR_isError(code_01), uVar1 == 0))
          && (code_00 + code_01 < code)))) {
        ZSTD_deriveBlockSplitsHelper(splits,startIdx,endIdx_00,zc,origSeqStore);
        splits->splitLocations[splits->idx] = (U32)endIdx_00;
        splits->idx = splits->idx + 1;
        ZSTD_deriveBlockSplitsHelper(splits,endIdx_00,endIdx,zc,origSeqStore);
      }
    }
    return;
  }
  __assert_fail("endIdx >= startIdx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0xfd0,
                "void ZSTD_deriveBlockSplitsHelper(seqStoreSplits *, size_t, size_t, ZSTD_CCtx *, const seqStore_t *)"
               );
}

Assistant:

static void
ZSTD_deriveBlockSplitsHelper(seqStoreSplits* splits, size_t startIdx, size_t endIdx,
                             ZSTD_CCtx* zc, const seqStore_t* origSeqStore)
{
    seqStore_t* const fullSeqStoreChunk = &zc->blockSplitCtx.fullSeqStoreChunk;
    seqStore_t* const firstHalfSeqStore = &zc->blockSplitCtx.firstHalfSeqStore;
    seqStore_t* const secondHalfSeqStore = &zc->blockSplitCtx.secondHalfSeqStore;
    size_t estimatedOriginalSize;
    size_t estimatedFirstHalfSize;
    size_t estimatedSecondHalfSize;
    size_t midIdx = (startIdx + endIdx)/2;

    DEBUGLOG(5, "ZSTD_deriveBlockSplitsHelper: startIdx=%zu endIdx=%zu", startIdx, endIdx);
    assert(endIdx >= startIdx);
    if (endIdx - startIdx < MIN_SEQUENCES_BLOCK_SPLITTING || splits->idx >= ZSTD_MAX_NB_BLOCK_SPLITS) {
        DEBUGLOG(6, "ZSTD_deriveBlockSplitsHelper: Too few sequences (%zu)", endIdx - startIdx);
        return;
    }
    ZSTD_deriveSeqStoreChunk(fullSeqStoreChunk, origSeqStore, startIdx, endIdx);
    ZSTD_deriveSeqStoreChunk(firstHalfSeqStore, origSeqStore, startIdx, midIdx);
    ZSTD_deriveSeqStoreChunk(secondHalfSeqStore, origSeqStore, midIdx, endIdx);
    estimatedOriginalSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(fullSeqStoreChunk, zc);
    estimatedFirstHalfSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(firstHalfSeqStore, zc);
    estimatedSecondHalfSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(secondHalfSeqStore, zc);
    DEBUGLOG(5, "Estimated original block size: %zu -- First half split: %zu -- Second half split: %zu",
             estimatedOriginalSize, estimatedFirstHalfSize, estimatedSecondHalfSize);
    if (ZSTD_isError(estimatedOriginalSize) || ZSTD_isError(estimatedFirstHalfSize) || ZSTD_isError(estimatedSecondHalfSize)) {
        return;
    }
    if (estimatedFirstHalfSize + estimatedSecondHalfSize < estimatedOriginalSize) {
        DEBUGLOG(5, "split decided at seqNb:%zu", midIdx);
        ZSTD_deriveBlockSplitsHelper(splits, startIdx, midIdx, zc, origSeqStore);
        splits->splitLocations[splits->idx] = (U32)midIdx;
        splits->idx++;
        ZSTD_deriveBlockSplitsHelper(splits, midIdx, endIdx, zc, origSeqStore);
    }
}